

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O0

string * vkt::SpirVAssembly::makeTessControlShaderAssembly
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *fragments)

{
  allocator<char> local_59;
  string local_58;
  StringTemplate local_38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *fragments_local;
  
  local_18 = fragments;
  fragments_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "OpCapability Tessellation\nOpCapability ClipDistance\nOpCapability CullDistance\nOpMemoryModel Logical GLSL450\nOpEntryPoint TessellationControl %BP_main \"main\" %BP_out_color %BP_gl_InvocationID %BP_in_color %BP_gl_out %BP_gl_in %BP_gl_TessLevelOuter %BP_gl_TessLevelInner\nOpExecutionMode %BP_main OutputVertices 3\n${debug:opt}\nOpName %BP_main \"main\"\nOpName %test_code \"testfun(vf4;\"\nOpName %BP_out_color \"out_color\"\nOpName %BP_gl_InvocationID \"gl_InvocationID\"\nOpName %BP_in_color \"in_color\"\nOpName %BP_gl_PerVertex \"gl_PerVertex\"\nOpMemberName %BP_gl_PerVertex 0 \"gl_Position\"\nOpMemberName %BP_gl_PerVertex 1 \"gl_PointSize\"\nOpMemberName %BP_gl_PerVertex 2 \"gl_ClipDistance\"\nOpMemberName %BP_gl_PerVertex 3 \"gl_CullDistance\"\nOpName %BP_gl_out \"gl_out\"\nOpName %BP_gl_PVOut \"gl_PerVertex\"\nOpMemberName %BP_gl_PVOut 0 \"gl_Position\"\nOpMemberName %BP_gl_PVOut 1 \"gl_PointSize\"\nOpMemberName %BP_gl_PVOut 2 \"gl_ClipDistance\"\nOpMemberName %BP_gl_PVOut 3 \"gl_CullDistance\"\nOpName %BP_gl_in \"gl_in\"\nOpName %BP_gl_TessLevelOuter \"gl_TessLevelOuter\"\nOpName %BP_gl_TessLevelInner \"gl_TessLevelInner\"\nOpDecorate %BP_out_color Location 1\nOpDecorate %BP_gl_InvocationID BuiltIn InvocationId\nOpDecorate %BP_in_color Location 1\nOpMemberDecorate %BP_gl_PerVertex 0 BuiltIn Position\nOpMemberDecorate %BP_gl_PerVertex 1 BuiltIn PointSize\nOpMemberDecorate %BP_gl_PerVertex 2 BuiltIn ClipDistance\nOpMemberDecorate %BP_gl_PerVertex 3 BuiltIn CullDistance\nOpDecorate %BP_gl_PerVertex Block\nOpMemberDecorate %BP_gl_PVOut 0 BuiltIn Position\nOpMemberDecorate %BP_gl_PVOut 1 BuiltIn PointSize\nOpMemberDecorate %BP_gl_PVOut 2 BuiltIn ClipDistance\nOpMemberDecorate %BP_gl_PVOut 3 BuiltIn CullDistance\nOpDecorate %BP_gl_PVOut Block\nOpDecorate %BP_gl_TessLevelOuter Patch\nOpDecorate %BP_gl_TessLevelOuter BuiltIn TessLevelOuter\nOpDecorate %BP_gl_TessLevelInner Patch\nOpDecorate %BP_gl_TessLevelInner BuiltIn TessLevelInner\n${decoration:opt}\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = Op..." /* TRUNCATED STRING LITERAL */
             ,&local_59);
  tcu::StringTemplate::StringTemplate(&local_38,&local_58);
  tcu::StringTemplate::specialize(__return_storage_ptr__,&local_38,local_18);
  tcu::StringTemplate::~StringTemplate(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

string makeTessControlShaderAssembly (const map<string, string>& fragments)
{
	static const char tessControlShaderBoilerplate[] =
		"OpCapability Tessellation\n"
		"OpCapability ClipDistance\n"
		"OpCapability CullDistance\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint TessellationControl %BP_main \"main\" %BP_out_color %BP_gl_InvocationID %BP_in_color %BP_gl_out %BP_gl_in %BP_gl_TessLevelOuter %BP_gl_TessLevelInner\n"
		"OpExecutionMode %BP_main OutputVertices 3\n"
		"${debug:opt}\n"
		"OpName %BP_main \"main\"\n"
		"OpName %test_code \"testfun(vf4;\"\n"
		"OpName %BP_out_color \"out_color\"\n"
		"OpName %BP_gl_InvocationID \"gl_InvocationID\"\n"
		"OpName %BP_in_color \"in_color\"\n"
		"OpName %BP_gl_PerVertex \"gl_PerVertex\"\n"
		"OpMemberName %BP_gl_PerVertex 0 \"gl_Position\"\n"
		"OpMemberName %BP_gl_PerVertex 1 \"gl_PointSize\"\n"
		"OpMemberName %BP_gl_PerVertex 2 \"gl_ClipDistance\"\n"
		"OpMemberName %BP_gl_PerVertex 3 \"gl_CullDistance\"\n"
		"OpName %BP_gl_out \"gl_out\"\n"
		"OpName %BP_gl_PVOut \"gl_PerVertex\"\n"
		"OpMemberName %BP_gl_PVOut 0 \"gl_Position\"\n"
		"OpMemberName %BP_gl_PVOut 1 \"gl_PointSize\"\n"
		"OpMemberName %BP_gl_PVOut 2 \"gl_ClipDistance\"\n"
		"OpMemberName %BP_gl_PVOut 3 \"gl_CullDistance\"\n"
		"OpName %BP_gl_in \"gl_in\"\n"
		"OpName %BP_gl_TessLevelOuter \"gl_TessLevelOuter\"\n"
		"OpName %BP_gl_TessLevelInner \"gl_TessLevelInner\"\n"
		"OpDecorate %BP_out_color Location 1\n"
		"OpDecorate %BP_gl_InvocationID BuiltIn InvocationId\n"
		"OpDecorate %BP_in_color Location 1\n"
		"OpMemberDecorate %BP_gl_PerVertex 0 BuiltIn Position\n"
		"OpMemberDecorate %BP_gl_PerVertex 1 BuiltIn PointSize\n"
		"OpMemberDecorate %BP_gl_PerVertex 2 BuiltIn ClipDistance\n"
		"OpMemberDecorate %BP_gl_PerVertex 3 BuiltIn CullDistance\n"
		"OpDecorate %BP_gl_PerVertex Block\n"
		"OpMemberDecorate %BP_gl_PVOut 0 BuiltIn Position\n"
		"OpMemberDecorate %BP_gl_PVOut 1 BuiltIn PointSize\n"
		"OpMemberDecorate %BP_gl_PVOut 2 BuiltIn ClipDistance\n"
		"OpMemberDecorate %BP_gl_PVOut 3 BuiltIn CullDistance\n"
		"OpDecorate %BP_gl_PVOut Block\n"
		"OpDecorate %BP_gl_TessLevelOuter Patch\n"
		"OpDecorate %BP_gl_TessLevelOuter BuiltIn TessLevelOuter\n"
		"OpDecorate %BP_gl_TessLevelInner Patch\n"
		"OpDecorate %BP_gl_TessLevelInner BuiltIn TessLevelInner\n"
		"${decoration:opt}\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%BP_out_color = OpVariable %op_a3v4f32 Output\n"
		"%BP_gl_InvocationID = OpVariable %ip_i32 Input\n"
		"%BP_in_color = OpVariable %ip_a32v4f32 Input\n"
		"%BP_gl_PerVertex = OpTypeStruct %v4f32 %f32 %a1f32 %a1f32\n"
		"%BP_a3_gl_PerVertex = OpTypeArray %BP_gl_PerVertex %c_u32_3\n"
		"%BP_op_a3_gl_PerVertex = OpTypePointer Output %BP_a3_gl_PerVertex\n"
		"%BP_gl_out = OpVariable %BP_op_a3_gl_PerVertex Output\n"
		"%BP_gl_PVOut = OpTypeStruct %v4f32 %f32 %a1f32 %a1f32\n"
		"%BP_a32_gl_PVOut = OpTypeArray %BP_gl_PVOut %c_u32_32\n"
		"%BP_ip_a32_gl_PVOut = OpTypePointer Input %BP_a32_gl_PVOut\n"
		"%BP_gl_in = OpVariable %BP_ip_a32_gl_PVOut Input\n"
		"%BP_gl_TessLevelOuter = OpVariable %op_a4f32 Output\n"
		"%BP_gl_TessLevelInner = OpVariable %op_a2f32 Output\n"
		"${pre_main:opt}\n"

		"%BP_main = OpFunction %void None %fun\n"
		"%BP_label = OpLabel\n"

		"%BP_gl_Invoc = OpLoad %i32 %BP_gl_InvocationID\n"

		"%BP_in_col_loc = OpAccessChain %ip_v4f32 %BP_in_color %BP_gl_Invoc\n"
		"%BP_out_col_loc = OpAccessChain %op_v4f32 %BP_out_color %BP_gl_Invoc\n"
		"%BP_in_col_val = OpLoad %v4f32 %BP_in_col_loc\n"
		"%BP_clr_transformed = OpFunctionCall %v4f32 %test_code %BP_in_col_val\n"
		"OpStore %BP_out_col_loc %BP_clr_transformed\n"

		"%BP_in_pos_loc = OpAccessChain %ip_v4f32 %BP_gl_in %BP_gl_Invoc %c_i32_0\n"
		"%BP_out_pos_loc = OpAccessChain %op_v4f32 %BP_gl_out %BP_gl_Invoc %c_i32_0\n"
		"%BP_in_pos_val = OpLoad %v4f32 %BP_in_pos_loc\n"
		"OpStore %BP_out_pos_loc %BP_in_pos_val\n"

		"%BP_cmp = OpIEqual %bool %BP_gl_Invoc %c_i32_0\n"
		"OpSelectionMerge %BP_merge_label None\n"
		"OpBranchConditional %BP_cmp %BP_if_label %BP_merge_label\n"
		"%BP_if_label = OpLabel\n"
		"%BP_gl_TessLevelOuterPos_0 = OpAccessChain %op_f32 %BP_gl_TessLevelOuter %c_i32_0\n"
		"%BP_gl_TessLevelOuterPos_1 = OpAccessChain %op_f32 %BP_gl_TessLevelOuter %c_i32_1\n"
		"%BP_gl_TessLevelOuterPos_2 = OpAccessChain %op_f32 %BP_gl_TessLevelOuter %c_i32_2\n"
		"%BP_gl_TessLevelInnerPos_0 = OpAccessChain %op_f32 %BP_gl_TessLevelInner %c_i32_0\n"
		"OpStore %BP_gl_TessLevelOuterPos_0 %c_f32_1\n"
		"OpStore %BP_gl_TessLevelOuterPos_1 %c_f32_1\n"
		"OpStore %BP_gl_TessLevelOuterPos_2 %c_f32_1\n"
		"OpStore %BP_gl_TessLevelInnerPos_0 %c_f32_1\n"
		"OpBranch %BP_merge_label\n"
		"%BP_merge_label = OpLabel\n"
		"OpReturn\n"
		"OpFunctionEnd\n"
		"${testfun}\n";
	return tcu::StringTemplate(tessControlShaderBoilerplate).specialize(fragments);
}